

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

Token * __thiscall EOPlus::Lexer::ReadIdentifier(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  string *this_00;
  char c;
  Token *local_178;
  string s;
  code *local_150 [2];
  code *local_140;
  code *local_138;
  code *local_130 [2];
  code *local_120;
  code *local_118;
  undefined1 local_110 [64];
  undefined1 local_d0 [64];
  string local_90;
  undefined1 local_70 [64];
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  local_130[1] = (code *)0x0;
  c = '\0';
  s.field_2._M_local_buf[0] = '\0';
  local_130[0] = ctype_ident_start;
  local_118 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_120 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar1 = GetCharIf(this,&c,(function<bool_(char)> *)local_130);
  std::_Function_base::~_Function_base((_Function_base *)local_130);
  if (bVar1) {
    std::__cxx11::string::push_back((char)&s);
    local_178 = __return_storage_ptr__;
    while( true ) {
      local_150[1] = (code *)0x0;
      local_150[0] = ctype_ident;
      local_138 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
      local_140 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
      bVar1 = GetCharIf(this,&c,(function<bool_(char)> *)local_150);
      std::_Function_base::~_Function_base((_Function_base *)local_150);
      if (!bVar1) break;
      std::__cxx11::string::push_back((char)&s);
    }
    util::lowercase(&local_90,&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar1 = std::operator==(&s,"true");
    if (!bVar1) {
      bVar1 = std::operator==(&s,"false");
      if (!bVar1) {
        util::variant::variant((variant *)local_110,&s);
        __return_storage_ptr__ = local_178;
        Token::Token(local_178,Identifier,(variant *)local_110);
        this_00 = (string *)(local_110 + 0x10);
        goto LAB_0012e9e0;
      }
    }
    bVar1 = std::operator==(&s,"true");
    util::variant::variant((variant *)local_d0,bVar1);
    __return_storage_ptr__ = local_178;
    Token::Token(local_178,Boolean,(variant *)local_d0);
    this_00 = (string *)(local_d0 + 0x10);
  }
  else {
    util::variant::variant((variant *)local_70);
    Token::Token(__return_storage_ptr__,Invalid,(variant *)local_70);
    this_00 = (string *)(local_70 + 0x10);
  }
LAB_0012e9e0:
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadIdentifier()
	{
		char c = '\0';
		std::string s;

		if (!this->GetCharIf(c, ctype_ident_start))
			return Token();

		s += c;

		while (this->GetCharIf(c, ctype_ident))
		{
			s += c;
		}

		s = util::lowercase(s);

		if (s == "true" || s == "false")
		{
			return Token(Token::Boolean, s == "true" ? true : false);
		}
		else
		{
			return Token(Token::Identifier, s);
		}
	}